

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weighted_graph.h
# Opt level: O0

WeightedGraph<int,_int> * __thiscall
data_structures::WeightedGraph<int,_int>::addVertex(WeightedGraph<int,_int> *this,int *vertex)

{
  int *key;
  RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_> *v
  ;
  RBTree<int,_data_structures::WeightedGraphAdjSet<int,_int>_> *this_00;
  WeightedGraphAdjSet<int,_int> local_50;
  int *local_18;
  int *vertex_local;
  WeightedGraph<int,_int> *this_local;
  
  this_00 = &this->_tree;
  local_18 = vertex;
  vertex_local = (int *)this;
  RBTree<int,_data_structures::WeightedGraphAdjSet<int,_int>_>::add(this_00,vertex);
  key = local_18;
  v = RBTree<int,_data_structures::WeightedGraphAdjSet<int,_int>_>::getNode(this_00,local_18);
  WeightedGraphAdjSet<int,_int>::WeightedGraphAdjSet(&local_50,v);
  RBTree<int,_data_structures::WeightedGraphAdjSet<int,_int>_>::set(this_00,key,&local_50);
  WeightedGraphAdjSet<int,_int>::~WeightedGraphAdjSet(&local_50);
  return this;
}

Assistant:

inline
    WeightedGraph<T, Weight>& WeightedGraph<T, Weight>::addVertex(const T &vertex){
        _tree.add(vertex);
        _tree.set(vertex, WeightedGraphAdjSet<T, Weight>(_tree.getNode(vertex)));
        return *this;
    }